

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

string * cfd::core::ConvertToString<std::__cxx11::string>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  string *in_RSI;
  UniValue *in_RDI;
  UniValue json_value;
  string *result;
  string *in_stack_ffffffffffffff78;
  UniValue *in_stack_ffffffffffffff80;
  UniValue local_68;
  
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff78,in_RSI);
  UniValue::UniValue(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  UniValue::write_abi_cxx11_(in_RDI,(int)&local_68,(void *)0x0,0);
  UniValue::~UniValue(&local_68);
  return (string *)in_RDI;
}

Assistant:

inline std::string ConvertToString(const T& value) {  // NOLINT
  UniValue json_value(static_cast<T>(value));
  std::string result = json_value.write();
  return result;
}